

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

int katherine_set_sensor_register(katherine_device_t *device,char reg_idx,int32_t reg_value)

{
  bool bVar1;
  int iVar2;
  int5 *piVar3;
  ulong uVar4;
  char ack [8];
  int5 local_30;
  undefined3 uStack_2b;
  undefined1 local_28 [8];
  
  iVar2 = katherine_udp_mutex_lock(&device->control_socket);
  if (iVar2 == 0) {
    _local_30 = CONCAT35(0x800,(uint5)(byte)reg_idx << 0x20);
    if (0 < reg_value) {
      piVar3 = &local_30;
      uVar4 = (ulong)(uint)reg_value;
      do {
        *(char *)piVar3 = (char)uVar4;
        piVar3 = (int5 *)((long)piVar3 + 1);
        bVar1 = 0xff < uVar4;
        uVar4 = uVar4 >> 8;
      } while (bVar1);
    }
    iVar2 = katherine_udp_send_exact(&device->control_socket,&local_30,8);
    if (iVar2 == 0) {
      iVar2 = katherine_udp_recv_exact(&device->control_socket,local_28,8);
    }
  }
  katherine_udp_mutex_unlock(&device->control_socket);
  return iVar2;
}

Assistant:

int
katherine_set_sensor_register(katherine_device_t *device, char reg_idx, int32_t reg_value)
{
    int res;

    res = katherine_udp_mutex_lock(&device->control_socket);
    if (res) goto err;

    char cmd[8] = {0};
    cmd[6] = CMD_TYPE_SENSOR_REGISTER_SETTING;
    cmd[4] = reg_idx;
    katherine_cmd_long(cmd, reg_value);

    res = katherine_cmd(&device->control_socket, &cmd, sizeof(cmd));
    if (res) goto err;

    res = katherine_cmd_wait_ack(&device->control_socket);
    if (res) goto err;

    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return 0;

err:
    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return res;
}